

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

DoubleToStringConverter * FIX::double_conversion::DoubleToStringConverter::EcmaScriptConverter(void)

{
  if (EcmaScriptConverter()::converter == '\0') {
    EcmaScriptConverter();
  }
  return &EcmaScriptConverter::converter;
}

Assistant:

const DoubleToStringConverter& DoubleToStringConverter::EcmaScriptConverter() {
  int flags = UNIQUE_ZERO | EMIT_POSITIVE_EXPONENT_SIGN;
  static DoubleToStringConverter converter(flags,
                                           "Infinity",
                                           "NaN",
                                           'e',
                                           -6, 21,
                                           6, 0);
  return converter;
}